

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

string * __thiscall
args::EitherFlag::str
          (string *__return_storage_ptr__,EitherFlag *this,string *shortPrefix,string *longPrefix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->isShort == true) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_38,'\x01');
    std::operator+(__return_storage_ptr__,shortPrefix,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::operator+(__return_storage_ptr__,longPrefix,&this->longFlag);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str(const std::string &shortPrefix, const std::string &longPrefix) const
        {
            return isShort ? shortPrefix + std::string(1, shortFlag) : longPrefix + longFlag;
        }